

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

Bitset * __thiscall
diligent_spirv_cross::ParsedIR::get_member_decoration_bitset
          (ParsedIR *this,TypeID id,uint32_t index)

{
  ulong uVar1;
  size_t sVar2;
  Decoration *pDVar3;
  ID local_34;
  Meta *local_30;
  Meta *m;
  ParsedIR *pPStack_20;
  uint32_t index_local;
  ParsedIR *this_local;
  Bitset *pBStack_10;
  TypeID id_local;
  
  m._4_4_ = index;
  pPStack_20 = this;
  this_local._4_4_ = id.id;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)1>
            (&local_34,(TypedID<(diligent_spirv_cross::Types)1> *)((long)&this_local + 4));
  local_30 = find_meta(this,local_34);
  if (local_30 == (Meta *)0x0) {
    pBStack_10 = &this->cleared_bitset;
  }
  else {
    uVar1 = (ulong)m._4_4_;
    sVar2 = VectorView<diligent_spirv_cross::Meta::Decoration>::size
                      (&(local_30->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>
                      );
    if (uVar1 < sVar2) {
      pDVar3 = VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                         (&(local_30->members).
                           super_VectorView<diligent_spirv_cross::Meta::Decoration>,(ulong)m._4_4_);
      pBStack_10 = &pDVar3->decoration_flags;
    }
    else {
      pBStack_10 = &this->cleared_bitset;
    }
  }
  return pBStack_10;
}

Assistant:

const Bitset &ParsedIR::get_member_decoration_bitset(TypeID id, uint32_t index) const
{
	auto *m = find_meta(id);
	if (m)
	{
		if (index >= m->members.size())
			return cleared_bitset;
		return m->members[index].decoration_flags;
	}
	else
		return cleared_bitset;
}